

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *value1;
  csharp *this_00;
  ulong uVar3;
  bool bVar4;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  FieldGeneratorBase *pFVar8;
  Descriptor *pDVar9;
  Options *pOVar10;
  ulong uVar11;
  ulong *puVar12;
  _func_int **pp_Var13;
  int i;
  int i_00;
  FileDescriptor *descriptor;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar14;
  long lVar15;
  undefined8 uVar16;
  ulong uVar17;
  long lVar18;
  Printer *pPVar19;
  long lVar20;
  key_type local_160;
  Printer *local_140;
  EnumGenerator enumGenerator;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  long local_a8;
  key_type local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
  lVar15 = **(long **)this->descriptor_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&enumGenerator,lVar15,(*(long **)this->descriptor_)[1] + lVar15);
  paVar2 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"class_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"access_level","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  WriteMessageDocComment(printer,this->descriptor_);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6a) == '\x01') {
    io::Printer::Print(printer,"[global::System.ObsoleteAttribute]\n");
  }
  io::Printer::Print(printer,&vars,
                     "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n"
                    );
  pDVar9 = this->descriptor_;
  if (*(long *)(pDVar9 + 0x18) == 0) {
    GetReflectionClassName_abi_cxx11_(&local_50,*(csharp **)(pDVar9 + 0x10),descriptor);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    puVar12 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar12) {
      local_d8 = *puVar12;
      lStack_d0 = puVar7[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar12;
      local_e8 = (ulong *)*puVar7;
    }
    local_e0 = puVar7[1];
    *puVar7 = puVar12;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    pDVar9 = this->descriptor_;
    if (*(long *)(pDVar9 + 0x18) == 0) {
      plVar6 = (long *)(*(long *)(pDVar9 + 0x10) + 0x60);
    }
    else {
      plVar6 = (long *)(*(long *)(pDVar9 + 0x18) + 0x50);
    }
    SimpleItoa_abi_cxx11_
              (&local_c8,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pDVar9 - *plVar6) >> 3) * 0x3cf3cf3d),
               (int)local_e0);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    if (uVar11 < local_c8._M_string_length + local_e0) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar16 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_c8._M_string_length + local_e0) goto LAB_00268d8f;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00268d8f:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160.field_2._8_8_ = puVar7[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_160._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
         (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
    pp_Var13 = (_func_int **)(plVar6 + 2);
    if ((_func_int **)*plVar6 == pp_Var13) {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var13;
      enumGenerator.descriptor_._0_4_ = (undefined4)plVar6[3];
      enumGenerator.descriptor_._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var13;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)*plVar6;
    }
    enumGenerator.super_SourceGeneratorBase.descriptor_ = (FileDescriptor *)plVar6[1];
    *plVar6 = (long)pp_Var13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"descriptor_accessor","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
  }
  else {
    GetClassName_abi_cxx11_(&local_50,*(csharp **)(pDVar9 + 0x18),(Descriptor *)descriptor);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    puVar12 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar12) {
      local_d8 = *puVar12;
      lStack_d0 = plVar6[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar12;
      local_e8 = (ulong *)*plVar6;
    }
    local_e0 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    pDVar9 = this->descriptor_;
    if (*(long *)(pDVar9 + 0x18) == 0) {
      plVar6 = (long *)(*(long *)(pDVar9 + 0x10) + 0x60);
    }
    else {
      plVar6 = (long *)(*(long *)(pDVar9 + 0x18) + 0x50);
    }
    SimpleItoa_abi_cxx11_
              (&local_c8,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pDVar9 - *plVar6) >> 3) * 0x3cf3cf3d),
               (int)local_e0);
    uVar11 = 0xf;
    if (local_e8 != &local_d8) {
      uVar11 = local_d8;
    }
    if (uVar11 < local_c8._M_string_length + local_e0) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar16 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_c8._M_string_length + local_e0) goto LAB_00268bdc;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00268bdc:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160.field_2._8_8_ = puVar7[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_160._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
         (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
    pp_Var13 = (_func_int **)(plVar6 + 2);
    if ((_func_int **)*plVar6 == pp_Var13) {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var13;
      enumGenerator.descriptor_._0_4_ = (undefined4)plVar6[3];
      enumGenerator.descriptor_._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var13;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)*plVar6;
    }
    enumGenerator.super_SourceGeneratorBase.descriptor_ = (FileDescriptor *)plVar6[1];
    *plVar6 = (long)pp_Var13;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"descriptor_accessor","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
  }
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n"
                    );
  bVar4 = IsDescriptorOptionMessage(this->descriptor_);
  if (bVar4) {
    io::Printer::Print(printer,
                       "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n\n"
                      );
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n"
                    );
  GenerateCloningCode(this,printer);
  pDVar9 = this->descriptor_;
  local_140 = printer;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    lVar20 = 0;
    lVar15 = 0;
    pFVar14 = extraout_RDX;
    do {
      lVar18 = *(long *)(pDVar9 + 0x30);
      value1 = *(string **)(lVar18 + lVar20);
      local_a8 = lVar15;
      GetFieldConstantName_abi_cxx11_((string *)&enumGenerator,(csharp *)(lVar18 + lVar20),pFVar14);
      SimpleItoa_abi_cxx11_(&local_160,(protobuf *)(ulong)*(uint *)(lVar18 + 0x38 + lVar20),i);
      io::Printer::Print(local_140,
                         "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
                         ,"field_name",value1,"field_constant_name",(string *)&enumGenerator,"index"
                         ,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      pFVar8 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)(lVar18 + lVar20));
      pPVar19 = local_140;
      if (pFVar8 == (FieldGeneratorBase *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->() const [C = google::protobuf::compiler::csharp::FieldGeneratorBase]"
                     );
      }
      (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar8,local_140);
      lVar15 = local_a8;
      io::Printer::Print(pPVar19,"\n");
      (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar8);
      lVar15 = lVar15 + 1;
      pDVar9 = this->descriptor_;
      lVar20 = lVar20 + 0xa8;
      pFVar14 = extraout_RDX_00;
    } while (lVar15 < *(int *)(pDVar9 + 0x2c));
  }
  pDVar9 = this->descriptor_;
  pPVar19 = local_140;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar15 = 0;
    do {
      lVar20 = lVar15 * 0x30;
      local_a8 = lVar15;
      UnderscoresToCamelCase
                ((string *)&enumGenerator,*(string **)(*(long *)(pDVar9 + 0x40) + lVar20),false,
                 false);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_160);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      UnderscoresToCamelCase
                ((string *)&enumGenerator,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar20)
                 ,true,false);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"property_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_160);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&enumGenerator,"original_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)&enumGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      io::Printer::Print(pPVar19,&vars,
                         "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
                        );
      io::Printer::Indent(pPVar19);
      io::Printer::Print(pPVar19,"None = 0,\n");
      lVar15 = *(long *)(this->descriptor_ + 0x40);
      if (0 < *(int *)(lVar15 + 0x1c + lVar20)) {
        lVar18 = 0;
        pFVar14 = extraout_RDX_01;
        do {
          this_00 = *(csharp **)(*(long *)(lVar15 + 0x20 + lVar20) + lVar18 * 8);
          GetPropertyName_abi_cxx11_((string *)&enumGenerator,this_00,pFVar14);
          SimpleItoa_abi_cxx11_(&local_160,(protobuf *)(ulong)*(uint *)(this_00 + 0x38),i_00);
          io::Printer::Print(local_140,"$field_property_name$ = $index$,\n","field_property_name",
                             (string *)&enumGenerator,"index",&local_160);
          pFVar14 = extraout_RDX_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
            pFVar14 = extraout_RDX_03;
          }
          if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
              &enumGenerator.super_SourceGeneratorBase.options_) {
            operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                            (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                           file_extension)._M_dataplus._M_p + 1));
            pFVar14 = extraout_RDX_04;
          }
          lVar18 = lVar18 + 1;
          lVar15 = *(long *)(this->descriptor_ + 0x40);
        } while (lVar18 < *(int *)(lVar15 + 0x1c + lVar20));
      }
      pPVar19 = local_140;
      io::Printer::Outdent(local_140);
      io::Printer::Print(pPVar19,"}\n");
      io::Printer::Print(pPVar19,&vars,
                         "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar19);
      io::Printer::Print(pPVar19,&vars,
                         "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar19);
      io::Printer::Print(pPVar19,&vars,
                         "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
                        );
      lVar15 = local_a8 + 1;
      pDVar9 = this->descriptor_;
    } while (lVar15 < *(int *)(pDVar9 + 0x38));
  }
  GenerateFrameworkMethods(this,pPVar19);
  GenerateMessageSerializationMethods(this,pPVar19);
  GenerateMergingMethods(this,pPVar19);
  pDVar9 = this->descriptor_;
  if (*(int *)(pDVar9 + 0x58) < 1) {
    uVar11 = (ulong)*(int *)(pDVar9 + 0x48);
    bVar4 = 0 < (long)uVar11;
    if (0 < (long)uVar11) {
      if (*(char *)(*(long *)(*(long *)(pDVar9 + 0x50) + 0x20) + 0x6b) != '\x01') goto LAB_00269444;
      plVar6 = (long *)(*(long *)(pDVar9 + 0x50) + 200);
      uVar3 = 1;
      do {
        uVar17 = uVar3;
        if (uVar11 == uVar17) break;
        lVar15 = *plVar6;
        plVar6 = plVar6 + 0x15;
        uVar3 = uVar17 + 1;
      } while (*(char *)(lVar15 + 0x6b) != '\0');
      bVar4 = uVar17 < uVar11;
    }
    if (!bVar4) goto LAB_0026955d;
  }
LAB_00269444:
  io::Printer::Print(pPVar19,&vars,
                     "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar19);
  io::Printer::Print(pPVar19,"public static partial class Types {\n");
  io::Printer::Indent(pPVar19);
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x58)) {
    lVar20 = 0;
    lVar15 = 0;
    do {
      lVar18 = *(long *)(pDVar9 + 0x60);
      pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
      EnumGenerator::EnumGenerator(&enumGenerator,(EnumDescriptor *)(lVar18 + lVar20),pOVar10);
      EnumGenerator::Generate(&enumGenerator,local_140);
      EnumGenerator::~EnumGenerator(&enumGenerator);
      lVar15 = lVar15 + 1;
      pDVar9 = this->descriptor_;
      lVar20 = lVar20 + 0x38;
    } while (lVar15 < *(int *)(pDVar9 + 0x58));
  }
  pDVar9 = this->descriptor_;
  if (0 < *(int *)(pDVar9 + 0x48)) {
    lVar20 = 0;
    lVar15 = 0;
    do {
      lVar18 = *(long *)(pDVar9 + 0x50);
      if (*(char *)(*(long *)(lVar18 + 0x20 + lVar20) + 0x6b) == '\0') {
        pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        MessageGenerator((MessageGenerator *)&enumGenerator,(Descriptor *)(lVar18 + lVar20),pOVar10)
        ;
        Generate((MessageGenerator *)&enumGenerator,local_140);
        ~MessageGenerator((MessageGenerator *)&enumGenerator);
      }
      lVar15 = lVar15 + 1;
      pDVar9 = this->descriptor_;
      lVar20 = lVar20 + 0xa8;
    } while (lVar15 < *(int *)(pDVar9 + 0x48));
  }
  pPVar19 = local_140;
  io::Printer::Outdent(local_140);
  io::Printer::Print(pPVar19,"}\n#endregion\n\n");
LAB_0026955d:
  io::Printer::Outdent(pPVar19);
  io::Printer::Print(pPVar19,"}\n");
  io::Printer::Print(pPVar19,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  map<string, string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  
  printer->Print(
    vars,
    "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
	  vars,
	  "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  WriteGeneratedCodeAttributes(printer);

  printer->Print(
	  vars,
	  "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] = GetReflectionClassName(descriptor_->file())
        + ".Descriptor.MessageTypes[" + SimpleItoa(descriptor_->index()) + "]";
  } else {
    vars["descriptor_accessor"] = GetClassName(descriptor_->containing_type())
        + ".Descriptor.NestedTypes[" + SimpleItoa(descriptor_->index()) + "]";
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
	"public static pbr::MessageDescriptor Descriptor {\n"
	"  get { return $descriptor_accessor$; }\n"
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
    "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
    "  get { return Descriptor; }\n"
    "}\n"
    "\n");
  // CustomOptions property, only for options messages
  if (IsDescriptorOptionMessage(descriptor_)) {
    printer->Print(
      "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n"
       "\n");
  }

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$() {\n"
    "  OnConstruction();\n"
    "}\n\n"
    "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
      "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
      "public const int $field_constant_name$ = $index$;\n",
      "field_name", fieldDescriptor->name(),
      "field_constant_name", GetFieldConstantName(fieldDescriptor),
      "index", SimpleItoa(fieldDescriptor->number()));
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    vars["original_name"] = descriptor_->oneof_decl(i)->name();
    printer->Print(
      vars,
      "private object $name$_;\n"
      "/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\n"
      "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("$field_property_name$ = $index$,\n",
                     "field_property_name", GetPropertyName(field),
                     "index", SimpleItoa(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
	printer->Print(
	  vars,
	  "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
	  "public $property_name$OneofCase $property_name$Case {\n"
	  "  get { return $name$Case_; }\n"
	  "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
      "public void Clear$property_name$() {\n"
      "  $name$Case_ = $property_name$OneofCase.None;\n"
      "  $name$_ = null;\n"
      "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(
      vars,
      "#region Nested types\n"
      "/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(
            descriptor_->nested_type(i), this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n"
                   "#endregion\n"
                   "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}